

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_insert.cpp
# Opt level: O2

SinkResultType __thiscall
duckdb::PhysicalInsert::Sink
          (PhysicalInsert *this,ExecutionContext *context,DataChunk *insert_chunk,
          OperatorSinkInput *input)

{
  InsertGlobalState *gstate;
  InsertLocalState *lstate;
  DuckTableEntry *pDVar1;
  PhysicalInsert *context_00;
  _Head_base<0UL,_duckdb::OptimisticDataWriter_*,_false> __p;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  DataTable *args;
  __shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2> *p_Var4;
  undefined4 extraout_var_01;
  TableIOManager *args_1;
  pointer pRVar5;
  PhysicalIndex PVar6;
  RowGroupCollection *this_00;
  pointer this_01;
  idx_t iVar7;
  templated_unique_single_t collection;
  shared_ptr<duckdb::DataTableInfo,_true> table_info;
  unsigned_long max_row_id;
  _Head_base<0UL,_duckdb::RowGroupCollection_*,_false> local_78;
  PhysicalInsert *local_70;
  pthread_mutex_t *local_68;
  DuckTableEntry *local_60;
  unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_> local_58;
  _Head_base<0UL,_duckdb::OptimisticDataWriter_*,_false> local_50;
  __shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2> local_48;
  unsigned_long local_38;
  undefined4 extraout_var_00;
  
  gstate = (InsertGlobalState *)input->global_state;
  lstate = (InsertLocalState *)input->local_state;
  pDVar1 = gstate->table;
  iVar3 = (*(pDVar1->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
            super_CatalogEntry._vptr_CatalogEntry[0x10])(pDVar1);
  local_68 = (pthread_mutex_t *)CONCAT44(extraout_var,iVar3);
  DataChunk::Flatten(insert_chunk);
  local_60 = pDVar1;
  if (this->parallel == false) {
    local_70 = (PhysicalInsert *)context;
    iVar7 = OnConflictHandling(this,&pDVar1->super_TableCatalogEntry,context,gstate,lstate,
                               insert_chunk);
    gstate->insert_count = gstate->insert_count + iVar7 + insert_chunk->count;
    if (this->return_chunk == true) {
      ColumnDataCollection::Append(&gstate->return_collection,insert_chunk);
    }
    pDVar1 = local_60;
    DataTable::LocalAppend
              ((DataTable *)&local_68->__data,&local_60->super_TableCatalogEntry,
               *(ClientContext **)&local_70->super_PhysicalOperator,insert_chunk,
               &this->bound_constraints);
    context_00 = local_70;
    if ((this->action_type == UPDATE) && ((lstate->update_chunk).count != 0)) {
      HandleInsertConflicts<true>
                (&pDVar1->super_TableCatalogEntry,(ExecutionContext *)local_70,lstate,gstate,
                 &lstate->update_chunk,this);
      HandleInsertConflicts<false>
                (&pDVar1->super_TableCatalogEntry,(ExecutionContext *)context_00,lstate,gstate,
                 &lstate->update_chunk,this);
    }
  }
  else {
    local_70 = this;
    iVar3 = (*(gstate->table->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
              super_CatalogEntry._vptr_CatalogEntry[0x10])();
    args = (DataTable *)CONCAT44(extraout_var_00,iVar3);
    if ((lstate->collection_index).index == 0xffffffffffffffff) {
      p_Var4 = (__shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2> *)
               DataTable::GetDataTableInfo((DataTable *)&local_68->__data);
      ::std::__shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_48,p_Var4);
      iVar3 = (*(local_60->super_TableCatalogEntry).super_StandardEntry.super_InCatalogEntry.
                super_CatalogEntry._vptr_CatalogEntry[0x10])();
      args_1 = TableIOManager::Get((DataTable *)CONCAT44(extraout_var_01,iVar3));
      local_38 = NumericCastImpl<unsigned_long,_long,_false>::Convert(0x7ffffffffff080);
      make_uniq<duckdb::RowGroupCollection,duckdb::shared_ptr<duckdb::DataTableInfo,true>,duckdb::TableIOManager&,duckdb::vector<duckdb::LogicalType,true>const&,unsigned_long&>
                ((duckdb *)&local_78,(shared_ptr<duckdb::DataTableInfo,_true> *)&local_48,args_1,
                 &local_70->insert_types,&local_38);
      pRVar5 = unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
               ::operator->((unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
                             *)&local_78);
      RowGroupCollection::InitializeEmpty(pRVar5);
      pRVar5 = unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
               ::operator->((unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
                             *)&local_78);
      RowGroupCollection::InitializeAppend(pRVar5,&lstate->local_append_state);
      ::std::mutex::lock(&gstate->lock);
      local_68 = (pthread_mutex_t *)&gstate->lock;
      make_uniq<duckdb::OptimisticDataWriter,duckdb::DataTable&>((duckdb *)&local_50,args);
      __p._M_head_impl = local_50._M_head_impl;
      local_50._M_head_impl = (pointer)0x0;
      ::std::
      __uniq_ptr_impl<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
      ::reset((__uniq_ptr_impl<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
               *)&lstate->optimistic_writer,__p._M_head_impl);
      ::std::
      unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>::
      ~unique_ptr((unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>_>
                   *)&local_50);
      local_58._M_t.
      super___uniq_ptr_impl<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RowGroupCollection_*,_std::default_delete<duckdb::RowGroupCollection>_>
      .super__Head_base<0UL,_duckdb::RowGroupCollection_*,_false>._M_head_impl =
           (__uniq_ptr_data<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true,_true>
            )(__uniq_ptr_data<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true,_true>
              )local_78._M_head_impl;
      local_78._M_head_impl = (RowGroupCollection *)0x0;
      PVar6 = DataTable::CreateOptimisticCollection
                        (args,context->client,
                         (unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>
                          *)&local_58);
      (lstate->collection_index).index = PVar6.index;
      ::std::
      unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>::
      ~unique_ptr(&local_58);
      pthread_mutex_unlock(local_68);
      ::std::
      unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>::
      ~unique_ptr((unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>_>
                   *)&local_78);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
    }
    OnConflictHandling(local_70,&local_60->super_TableCatalogEntry,context,gstate,lstate,
                       insert_chunk);
    this_00 = DataTable::GetOptimisticCollection
                        (args,context->client,(PhysicalIndex)(lstate->collection_index).index);
    bVar2 = RowGroupCollection::Append(this_00,insert_chunk,&lstate->local_append_state);
    if (bVar2) {
      this_01 = unique_ptr<duckdb::OptimisticDataWriter,_std::default_delete<duckdb::OptimisticDataWriter>,_true>
                ::operator->(&lstate->optimistic_writer);
      OptimisticDataWriter::WriteNewRowGroup(this_01,this_00);
    }
  }
  return NEED_MORE_INPUT;
}

Assistant:

SinkResultType PhysicalInsert::Sink(ExecutionContext &context, DataChunk &insert_chunk,
                                    OperatorSinkInput &input) const {
	auto &gstate = input.global_state.Cast<InsertGlobalState>();
	auto &lstate = input.local_state.Cast<InsertLocalState>();

	auto &table = gstate.table;
	auto &storage = table.GetStorage();
	insert_chunk.Flatten();

	if (!parallel) {
		idx_t updated_tuples = OnConflictHandling(table, context, gstate, lstate, insert_chunk);

		gstate.insert_count += insert_chunk.size();
		gstate.insert_count += updated_tuples;
		if (return_chunk) {
			gstate.return_collection.Append(insert_chunk);
		}
		storage.LocalAppend(table, context.client, insert_chunk, bound_constraints);
		if (action_type == OnConflictAction::UPDATE && lstate.update_chunk.size() != 0) {
			(void)HandleInsertConflicts<true>(table, context, lstate, gstate, lstate.update_chunk, *this);
			(void)HandleInsertConflicts<false>(table, context, lstate, gstate, lstate.update_chunk, *this);
			// All of the tuples should have been turned into an update, leaving the chunk empty afterwards
			D_ASSERT(lstate.update_chunk.size() == 0);
		}
		return SinkResultType::NEED_MORE_INPUT;
	}

	// Parallel append.
	D_ASSERT(!return_chunk);
	auto &data_table = gstate.table.GetStorage();
	if (!lstate.collection_index.IsValid()) {
		auto table_info = storage.GetDataTableInfo();
		auto &io_manager = TableIOManager::Get(table.GetStorage());

		// Create the local row group collection.
		auto max_row_id = NumericCast<idx_t>(MAX_ROW_ID);
		auto collection = make_uniq<RowGroupCollection>(std::move(table_info), io_manager, insert_types, max_row_id);
		collection->InitializeEmpty();
		collection->InitializeAppend(lstate.local_append_state);

		lock_guard<mutex> l(gstate.lock);
		lstate.optimistic_writer = make_uniq<OptimisticDataWriter>(data_table);
		lstate.collection_index = data_table.CreateOptimisticCollection(context.client, std::move(collection));
	}

	OnConflictHandling(table, context, gstate, lstate, insert_chunk);
	D_ASSERT(action_type != OnConflictAction::UPDATE);

	auto &collection = data_table.GetOptimisticCollection(context.client, lstate.collection_index);
	auto new_row_group = collection.Append(insert_chunk, lstate.local_append_state);
	if (new_row_group) {
		lstate.optimistic_writer->WriteNewRowGroup(collection);
	}
	return SinkResultType::NEED_MORE_INPUT;
}